

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathDifference(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  uint uVar1;
  int iVar2;
  xmlNodeSetPtr cur;
  ulong uVar3;
  xmlNodePtr val;
  
  cur = nodes1;
  if (((nodes2 != (xmlNodeSetPtr)0x0) && (nodes2->nodeNr != 0)) &&
     (nodes2->nodeTab != (xmlNodePtr *)0x0)) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
LAB_001bac72:
      cur = (xmlNodeSetPtr)0x0;
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
      if (nodes1 != (xmlNodeSetPtr)0x0) {
        uVar1 = nodes1->nodeNr;
        if (((ulong)uVar1 != 0) && (0 < (int)uVar1 && nodes1->nodeTab != (xmlNodePtr *)0x0)) {
          uVar3 = 0;
          do {
            if ((long)uVar3 < (long)nodes1->nodeNr) {
              val = nodes1->nodeTab[uVar3];
            }
            else {
              val = (xmlNodePtr)0x0;
            }
            iVar2 = xmlXPathNodeSetContains(nodes2,val);
            if ((iVar2 == 0) && (iVar2 = xmlXPathNodeSetAddUnique(cur,val), iVar2 < 0)) {
              xmlXPathFreeNodeSet(cur);
              goto LAB_001bac72;
            }
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
      }
    }
  }
  return cur;
}

Assistant:

xmlNodeSetPtr
xmlXPathDifference (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    xmlNodeSetPtr ret;
    int i, l1;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes2))
	return(nodes1);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(NULL);
    if (xmlXPathNodeSetIsEmpty(nodes1))
	return(ret);

    l1 = xmlXPathNodeSetGetLength(nodes1);

    for (i = 0; i < l1; i++) {
	cur = xmlXPathNodeSetItem(nodes1, i);
	if (!xmlXPathNodeSetContains(nodes2, cur)) {
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0) {
                xmlXPathFreeNodeSet(ret);
	        return(NULL);
            }
	}
    }
    return(ret);
}